

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec.h
# Opt level: O0

void __thiscall vec<IRR>::push(vec<IRR> *this,IRR *elem)

{
  void *pvVar1;
  int *in_RDI;
  IRR *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  uint in_stack_ffffffffffffffe4;
  
  if (*in_RDI == in_RDI[1]) {
    if ((uint)in_RDI[1] < 2) {
      in_stack_ffffffffffffffe4 = 2;
    }
    else {
      in_stack_ffffffffffffffe4 = in_RDI[1] * 3 + 1U >> 1;
    }
    in_RDI[1] = in_stack_ffffffffffffffe4;
    pvVar1 = realloc(*(void **)(in_RDI + 2),(ulong)(uint)in_RDI[1] << 5);
    *(void **)(in_RDI + 2) = pvVar1;
  }
  *in_RDI = *in_RDI + 1;
  IRR::IRR((IRR *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
           in_stack_ffffffffffffffd8);
  return;
}

Assistant:

void push(const T& elem) {
		if (sz == cap) {
			cap = cap <= 1 ? 2 : (cap * 3 + 1) >> 1;
			data = (T*)realloc((char*)data, cap * sizeof(T));
		}
		new (&data[sz++]) T(elem);
	}